

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

bool compareProvisioningTeams(QVariantMap *a,QVariantMap *b)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  byte bVar1;
  uint uVar2;
  long in_FS_OFFSET;
  int bFree;
  int aFree;
  char *in_stack_fffffffffffffec8;
  QVariant *pQVar3;
  QLatin1String *in_stack_fffffffffffffed0;
  QLatin1String *this;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint uVar4;
  char *this_00;
  qsizetype in_stack_fffffffffffffef0;
  QVariant *this_01;
  char *in_stack_fffffffffffffef8;
  QLatin1String local_a0;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = "isFreeProvisioningTeam";
  QLatin1String::QLatin1String(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  this = &local_a0;
  latin1.m_data = in_stack_fffffffffffffef8;
  latin1.m_size = in_stack_fffffffffffffef0;
  QString::QString((QString *)this,latin1);
  pQVar3 = &local_48;
  QVariant::QVariant((QVariant *)0x14a64c);
  QMap<QString,_QVariant>::value
            ((QMap<QString,_QVariant> *)this_00,
             (QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (QVariant *)this);
  bVar1 = QVariant::toBool();
  uVar2 = (uint)bVar1;
  QVariant::~QVariant(&local_28);
  QVariant::~QVariant(pQVar3);
  QString::~QString((QString *)0x14a69b);
  uVar4 = uVar2;
  QLatin1String::QLatin1String(this,(char *)pQVar3);
  latin1_00.m_data = in_stack_fffffffffffffef8;
  latin1_00.m_size = in_stack_fffffffffffffef0;
  QString::QString((QString *)this,latin1_00);
  pQVar3 = &local_88;
  QVariant::QVariant((QVariant *)0x14a6ea);
  this_01 = &local_68;
  QMap<QString,_QVariant>::value
            ((QMap<QString,_QVariant> *)this_00,(QString *)CONCAT44(uVar4,in_stack_fffffffffffffed8)
             ,(QVariant *)this);
  bVar1 = QVariant::toBool();
  QVariant::~QVariant(this_01);
  QVariant::~QVariant(pQVar3);
  QString::~QString((QString *)0x14a73a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)uVar2 < (int)(uint)bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool compareProvisioningTeams(const QVariantMap &a, const QVariantMap &b)
{
    int aFree = a.value(QLatin1String("isFreeProvisioningTeam")).toBool() ? 1 : 0;
    int bFree = b.value(QLatin1String("isFreeProvisioningTeam")).toBool() ? 1 : 0;
    return aFree < bFree;
}